

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

void duckdb::GetTreeWidthHeight<duckdb::LogicalOperator>
               (LogicalOperator *op,idx_t *width,idx_t *height)

{
  idx_t iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((op->children).
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->children).
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    *width = 1;
    iVar1 = 1;
  }
  else {
    *width = 0;
    *height = 0;
    local_10 = std::
               _Function_handler<void_(const_duckdb::LogicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_duckdb::LogicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
               ::_M_manager;
    local_28._M_unused._M_object = width;
    local_28._8_8_ = height;
    anon_unknown.dwarf_68bbba::TreeChildrenIterator::Iterate<duckdb::LogicalOperator>
              (op,(function<void_(const_duckdb::LogicalOperator_&)> *)&local_28);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
    iVar1 = *height + 1;
  }
  *height = iVar1;
  return;
}

Assistant:

static void GetTreeWidthHeight(const T &op, idx_t &width, idx_t &height) {
	if (!TreeChildrenIterator::HasChildren(op)) {
		width = 1;
		height = 1;
		return;
	}
	width = 0;
	height = 0;

	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		idx_t child_width, child_height;
		GetTreeWidthHeight<T>(child, child_width, child_height);
		width += child_width;
		height = MaxValue<idx_t>(height, child_height);
	});
	height++;
}